

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  int iVar1;
  uint uVar2;
  __sighandler_t p_Var3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int fd;
  ulong uVar7;
  sigset_t signewset;
  int local_b4;
  sigset_t local_b0;
  
  iVar5 = 1;
  do {
    if (((iVar5 != 9) && (iVar5 != 0x13)) &&
       (p_Var3 = signal(iVar5,(__sighandler_t)0x0), p_Var3 == (__sighandler_t)0xffffffffffffffff))
    goto LAB_00132c1f;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x20);
  if ((options->flags & 8) != 0) {
    setsid();
  }
  local_b4 = error_fd;
  if (0 < stdio_count) {
    uVar7 = 0;
    do {
      if ((uint)pipes[uVar7][1] < uVar7) {
        iVar5 = fcntl64((ulong)(uint)pipes[uVar7][1],0x406,(ulong)(uint)stdio_count);
        pipes[uVar7][1] = iVar5;
        if (iVar5 == -1) goto LAB_00132c30;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)stdio_count != uVar7);
    if (0 < stdio_count) {
      iVar5 = 0;
      do {
        iVar1 = pipes[iVar5][1];
        if (iVar1 < 0) {
          if (iVar5 < 3) {
            uv__close_nocheckstdio(iVar5);
            iVar1 = open64("/dev/null",(uint)(iVar5 != 0) * 2);
            if (-1 < iVar1) {
              iVar6 = iVar1;
              fd = iVar5;
              if (iVar5 != iVar1) goto LAB_00132b25;
              goto LAB_00132b53;
            }
            goto LAB_00132c30;
          }
        }
        else {
          iVar6 = -1;
          if (iVar5 == iVar1) {
            iVar1 = uv__cloexec(iVar5,0);
            iVar6 = -1;
            if (iVar1 != 0) {
              uv__write_int(error_fd,iVar1);
              return;
            }
          }
          else {
LAB_00132b25:
            iVar5 = dup2(iVar1,iVar5);
            if (iVar5 == -1) goto LAB_00132c30;
          }
          fd = iVar6;
          if ((iVar5 < 3) && (iVar6 == -1)) {
            uv__nonblock_fcntl(iVar5,0);
            fd = -1;
          }
LAB_00132b53:
          if (stdio_count <= fd) {
            uv__close(fd);
          }
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < stdio_count);
    }
  }
  if ((options->cwd == (char *)0x0) || (iVar5 = chdir(options->cwd), iVar5 == 0)) {
    uVar2 = options->flags;
    if ((uVar2 & 3) != 0) {
      piVar4 = __errno_location();
      iVar5 = *piVar4;
      setgroups(0,(__gid_t *)0x0);
      *piVar4 = iVar5;
      uVar2 = options->flags;
    }
    if ((uVar2 & 2) == 0) {
LAB_00132bbb:
      if (((uVar2 & 1) == 0) || (iVar5 = setuid(options->uid), iVar5 == 0)) {
        if (options->env != (char **)0x0) {
          _environ = options->env;
        }
        sigemptyset(&local_b0);
        iVar5 = sigprocmask(2,&local_b0,(sigset_t *)0x0);
        if (iVar5 != 0) goto LAB_00132c42;
        execvp(options->file,options->args);
        piVar4 = __errno_location();
        uv__write_int(error_fd,-*piVar4);
      }
    }
    else {
      iVar5 = setgid(options->gid);
      if (iVar5 == 0) {
        uVar2 = options->flags;
        goto LAB_00132bbb;
      }
    }
LAB_00132c1f:
    piVar4 = __errno_location();
    uv__write_int(error_fd,-*piVar4);
  }
LAB_00132c30:
  piVar4 = __errno_location();
  uv__write_int(local_b4,-*piVar4);
LAB_00132c42:
  abort();
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t signewset;
  int close_fd;
  int use_fd;
  int fd;
  int n;

  /* Reset signal disposition first. Use a hard-coded limit because NSIG is not
   * fixed on Linux: it's either 32, 34 or 64, depending on whether RT signals
   * are enabled. We are not allowed to touch RT signal handlers, glibc uses
   * them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_errno(error_fd);
  }

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
#ifdef F_DUPFD_CLOEXEC /* POSIX 2008 */
    pipes[fd][1] = fcntl(use_fd, F_DUPFD_CLOEXEC, stdio_count);
#else
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
#endif
    if (pipes[fd][1] == -1)
      uv__write_errno(error_fd);
#ifndef F_DUPFD_CLOEXEC /* POSIX 2008 */
    n = uv__cloexec(pipes[fd][1], 1);
    if (n)
      uv__write_int(error_fd, n);
#endif
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = -1;
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* Redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set. */
        uv__close_nocheckstdio(fd); /* Free up fd, if it happens to be open. */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0)
          uv__write_errno(error_fd);
      }
    }

    if (fd == use_fd) {
      if (close_fd == -1) {
        n = uv__cloexec(use_fd, 0);
        if (n)
          uv__write_int(error_fd, n);
      }
    }
    else {
      fd = dup2(use_fd, fd);
    }

    if (fd == -1)
      uv__write_errno(error_fd);

    if (fd <= 2 && close_fd == -1)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd))
    uv__write_errno(error_fd);

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid))
    uv__write_errno(error_fd);

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid))
    uv__write_errno(error_fd);

  if (options->env != NULL)
    environ = options->env;

  /* Reset signal mask just before exec. */
  sigemptyset(&signewset);
  if (sigprocmask(SIG_SETMASK, &signewset, NULL) != 0)
    abort();

#ifdef __MVS__
  execvpe(options->file, options->args, environ);
#else
  execvp(options->file, options->args);
#endif

  uv__write_errno(error_fd);
}